

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

string * __thiscall
miniros::Subscription::md5sum_abi_cxx11_(string *__return_storage_ptr__,Subscription *this)

{
  std::mutex::lock(&this->md5sum_mutex_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->md5sum_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->md5sum_mutex_);
  return __return_storage_ptr__;
}

Assistant:

const std::string Subscription::md5sum()
{
  std::scoped_lock<std::mutex> lock(md5sum_mutex_);
  return md5sum_;
}